

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DearchiverBase.cpp
# Opt level: O1

bool __thiscall
Diligent::DearchiverBase::PSOData<Diligent::RayTracingPipelineStateCreateInfo>::DeserializeInternal
          (PSOData<Diligent::RayTracingPipelineStateCreateInfo> *this,
          Serializer<(Diligent::SerializerMode)0> *Ser)

{
  bool bVar1;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(unsigned_int_&,_Diligent::IShader_*&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp:210:25)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(unsigned_int_&,_Diligent::IShader_*&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/src/DearchiverBase.cpp:210:25)>
             ::_M_manager;
  bVar1 = PSOSerializer<(Diligent::SerializerMode)0>::SerializeCreateInfo
                    (Ser,&this->CreateInfo,&this->PRSNames,&this->Allocator,
                     (function<void_(unsigned_int_&,_Diligent::IShader_*&)> *)&local_28);
  if (local_18 != (code *)0x0) {
    (*local_18)(&local_28,&local_28,__destroy_functor);
  }
  return bVar1;
}

Assistant:

bool DearchiverBase::PSOData<RayTracingPipelineStateCreateInfo>::DeserializeInternal(Serializer<SerializerMode::Read>& Ser)
{
    auto RemapShaders = [](Uint32& InIndex, IShader*& outShader) {
        outShader = BitCast<IShader*>(size_t{InIndex});
    };
    return PSOSerializer<SerializerMode::Read>::SerializeCreateInfo(Ser, CreateInfo, PRSNames, &Allocator, RemapShaders);
}